

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_encoder.cc
# Opt level: O0

bool __thiscall draco::ObjEncoder::EncodeFaceCorner(ObjEncoder *this,PointIndex vert_index)

{
  AttributeValueIndex AVar1;
  int32_t in_ESI;
  ObjEncoder *in_RDI;
  PointAttribute *in_stack_ffffffffffffffb8;
  PointIndex point_index;
  int32_t in_stack_ffffffffffffffcc;
  IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 uVar2;
  IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> local_24;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffffe4;
  int32_t iVar4;
  IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  undefined4 uVar5;
  
  buffer(in_RDI);
  uVar5 = CONCAT13(0x20,(int3)in_stack_ffffffffffffffec);
  EncoderBuffer::Encode<char>
            ((EncoderBuffer *)CONCAT44(uVar5,in_stack_ffffffffffffffe8.value_),
             (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  iVar4 = in_ESI;
  AVar1 = PointAttribute::mapped_index(in_stack_ffffffffffffffb8,(uint)in_RDI);
  IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::value
            ((IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> *)
             &stack0xffffffffffffffe8);
  EncodeInt((ObjEncoder *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0.value_),
            in_stack_ffffffffffffffcc);
  if ((in_RDI->tex_coord_att_ != (PointAttribute *)0x0) ||
     (in_RDI->normal_att_ != (PointAttribute *)0x0)) {
    buffer(in_RDI);
    uVar3 = CONCAT13(0x2f,(int3)in_stack_ffffffffffffffe0);
    EncoderBuffer::Encode<char>
              ((EncoderBuffer *)CONCAT44(uVar5,AVar1.value_),(char *)CONCAT44(iVar4,uVar3));
    if (in_RDI->tex_coord_att_ != (PointAttribute *)0x0) {
      local_24.value_ = (uint)PointAttribute::mapped_index(in_stack_ffffffffffffffb8,(uint)in_RDI);
      IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::value(&local_24);
      EncodeInt((ObjEncoder *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0.value_),
                in_stack_ffffffffffffffcc);
    }
    if (in_RDI->normal_att_ != (PointAttribute *)0x0) {
      buffer(in_RDI);
      point_index.value_ = (uint)in_RDI;
      uVar2 = CONCAT13(0x2f,(int3)in_stack_ffffffffffffffd4);
      EncoderBuffer::Encode<char>
                ((EncoderBuffer *)CONCAT44(uVar5,AVar1.value_),(char *)CONCAT44(iVar4,uVar3));
      AVar1 = PointAttribute::mapped_index(in_stack_ffffffffffffffb8,point_index);
      IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::value
                ((IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> *)
                 &stack0xffffffffffffffd0);
      EncodeInt((ObjEncoder *)CONCAT44(uVar2,AVar1.value_),in_ESI);
    }
  }
  return true;
}

Assistant:

bool ObjEncoder::EncodeFaceCorner(PointIndex vert_index) {
  buffer()->Encode(' ');
  // Note that in the OBJ format, all indices are encoded starting from index 1.
  // Encode position index.
  EncodeInt(pos_att_->mapped_index(vert_index).value() + 1);
  if (tex_coord_att_ || normal_att_) {
    // Encoding format is pos_index/tex_coord_index/normal_index.
    // If tex_coords are not present, we must encode pos_index//normal_index.
    buffer()->Encode('/');
    if (tex_coord_att_) {
      EncodeInt(tex_coord_att_->mapped_index(vert_index).value() + 1);
    }
    if (normal_att_) {
      buffer()->Encode('/');
      EncodeInt(normal_att_->mapped_index(vert_index).value() + 1);
    }
  }
  return true;
}